

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_slte(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  BtorSimBitVector *bv;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *res;
  uint32_t sign_b;
  uint32_t sign_a;
  uint32_t bit;
  uint32_t i;
  uint32_t in_stack_ffffffffffffffd4;
  byte bVar3;
  uint32_t local_18;
  
  bv = btorsim_bv_new(in_stack_ffffffffffffffd4);
  local_18 = 1;
  uVar1 = btorsim_bv_get_bit(in_RDI,in_RDI->width - 1);
  uVar2 = btorsim_bv_get_bit(in_RSI,in_RSI->width - 1);
  if (uVar1 == uVar2) {
    uVar1 = find_diff_index(in_RDI,in_RSI);
    if ((uVar1 < in_RDI->len) && ((&in_RSI[1].width)[uVar1] < (&in_RDI[1].width)[uVar1])) {
      local_18 = 0;
    }
  }
  else {
    bVar3 = 0;
    if (uVar1 != 0) {
      bVar3 = uVar2 != 0 ^ 0xff;
    }
    local_18 = (uint32_t)(bVar3 & 1);
  }
  btorsim_bv_set_bit(bv,0,local_18);
  return bv;
}

Assistant:

BtorSimBitVector *
btorsim_bv_slte (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit, sign_a, sign_b;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;

  sign_a = btorsim_bv_get_bit (a, a->width - 1);
  sign_b = btorsim_bv_get_bit (b, b->width - 1);

  if (sign_a == sign_b)
  {
    i = find_diff_index (a, b);
    if (i < a->len && a->bits[i] > b->bits[i]) bit = 0;
  }
  else
  {
    bit = sign_a && !sign_b;
  }

  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}